

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * sx_vsnprintf_alloc(sx_alloc *alloc,char *fmt,__va_list_tag *args)

{
  sx__printf_ctx ctx;
  sx_alloc *local_220;
  char *local_218;
  int local_210;
  char local_20c [516];
  
  local_218 = (char *)0x0;
  local_210 = 0;
  local_220 = alloc;
  stbsp_vsprintfcb(sx__vsnprintf_callback,&local_220,local_20c,fmt,args);
  local_218[local_210] = '\0';
  return local_218;
}

Assistant:

char* sx_vsnprintf_alloc(const sx_alloc* alloc, const char* fmt, va_list args)
{
    sx__printf_ctx ctx;
    ctx.alloc = alloc;
    ctx.buff = NULL;
    ctx.len = 0;
    stbsp_vsprintfcb(sx__vsnprintf_callback, &ctx, ctx.tmp, fmt, args);
    ctx.buff[ctx.len] = '\0';
    return ctx.buff;
}